

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool validate_get_msurf_descriptors
               (_func_void_integral_image_ptr_interest_point_ptr *original_function,
               vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
               *test_functions,integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  bool bVar1;
  const_reference pvVar2;
  bool bVar3;
  int i;
  ulong __n;
  int j;
  ulong uVar4;
  vector<interest_point,_std::allocator<interest_point>_> original_interest_points;
  interest_point test_ipoint;
  interest_point ref_ipoint;
  
  std::vector<interest_point,_std::allocator<interest_point>_>::vector
            (&original_interest_points,interest_points);
  bVar3 = true;
  for (__n = 0x32;
      __n < (ulong)(((long)(interest_points->
                           super__Vector_base<interest_point,_std::allocator<interest_point>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(interest_points->
                          super__Vector_base<interest_point,_std::allocator<interest_point>_>).
                          _M_impl.super__Vector_impl_data._M_start) / 0x114); __n = __n + 1) {
    pvVar2 = std::vector<interest_point,_std::allocator<interest_point>_>::at(interest_points,__n);
    memcpy(&ref_ipoint,pvVar2,0x114);
    (*original_function)(iimage,&ref_ipoint);
    for (uVar4 = 0; uVar4 < (ulong)(*(long *)(test_functions + 8) - *(long *)test_functions >> 3);
        uVar4 = uVar4 + 1) {
      pvVar2 = std::vector<interest_point,_std::allocator<interest_point>_>::at(interest_points,__n)
      ;
      memcpy(&test_ipoint,pvVar2,0x114);
      (**(code **)(*(long *)test_functions + uVar4 * 8))(iimage,&test_ipoint);
      bVar1 = compare_arrays_close(ref_ipoint.descriptor,test_ipoint.descriptor,0x40,0.001);
      if (!bVar1) {
        printf("ERROR: MSURF descriptor test function %d does not match original function\n",
               uVar4 & 0xffffffff);
      }
      bVar3 = (bool)(bVar3 & bVar1);
    }
  }
  std::_Vector_base<interest_point,_std::allocator<interest_point>_>::~_Vector_base
            (&original_interest_points.
              super__Vector_base<interest_point,_std::allocator<interest_point>_>);
  return bVar3;
}

Assistant:

bool validate_get_msurf_descriptors(
    void (*original_function)(struct integral_image *, struct interest_point *),
    const std::vector<void (*)(struct integral_image *, struct interest_point *)> &test_functions,
    struct integral_image *iimage, const std::vector<struct interest_point> *interest_points) {
    // Copying over interest points to new vector
    std::vector<struct interest_point> original_interest_points = *interest_points;

    bool all_valid = true;

    for (int i = 50; i < interest_points->size(); ++i) { 

        struct interest_point ref_ipoint = interest_points->at(i);
        original_function(iimage, &ref_ipoint);

        bool valid = true;
        for (int j = 0; j < test_functions.size(); ++j) {
            struct interest_point test_ipoint = interest_points->at(i);

            test_functions[j](iimage, &test_ipoint);

            bool valid = compare_arrays_close(ref_ipoint.descriptor, test_ipoint.descriptor, 64, VALIDATION_PRECISION);
            if (!valid) {
                printf("ERROR: MSURF descriptor test function %d does not match original function\n", j);
            }

            // Updating flag indicating if all functions are valid
            all_valid &= valid;
        }
    }

    return all_valid;
}